

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArrayBase::GetDiagValueString
          (TypedArrayBase *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  ScriptContext *this_00;
  charcount_t countNeeded;
  char16 *str;
  JavascriptString *local_28;
  JavascriptString *toStringResult;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  TypedArrayBase *this_local;
  
  toStringResult = (JavascriptString *)requestContext;
  requestContext_local = (ScriptContext *)stringBuilder;
  stringBuilder_local = (StringBuilder<Memory::ArenaAllocator> *)this;
  EnterPinnedScope(&local_28);
  local_28 = JavascriptObject::ToStringInternal(this,(ScriptContext *)toStringResult);
  this_00 = requestContext_local;
  str = JavascriptString::GetString(local_28);
  countNeeded = JavascriptString::GetLength(local_28);
  StringBuilder<Memory::ArenaAllocator>::Append
            ((StringBuilder<Memory::ArenaAllocator> *)this_00,str,countNeeded);
  LeavePinnedScope();
  return 1;
}

Assistant:

BOOL TypedArrayBase::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        ENTER_PINNED_SCOPE(JavascriptString, toStringResult);
        toStringResult = JavascriptObject::ToStringInternal(this, requestContext);
        stringBuilder->Append(toStringResult->GetString(), toStringResult->GetLength());
        LEAVE_PINNED_SCOPE();
        return TRUE;
    }